

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters_sse2.c
# Opt level: O2

void GradientFilter_SSE2(uint8_t *data,int width,int height,int stride,uint8_t *filtered_data)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  unkuint9 Var27;
  undefined1 auVar28 [11];
  undefined1 auVar29 [15];
  unkuint9 Var30;
  undefined1 auVar31 [11];
  undefined1 auVar32 [15];
  unkuint9 Var33;
  undefined1 auVar34 [11];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  long lVar41;
  char cVar42;
  int iVar43;
  int iVar44;
  int i;
  long lVar45;
  uint8_t *puVar46;
  uint8_t *puVar47;
  uint8_t *puVar48;
  uint length;
  long lVar49;
  long lVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  uint8_t *local_48;
  
  *filtered_data = *data;
  length = width - 1;
  PredictLineLeft_SSE2(data + 1,filtered_data + 1,length);
  lVar41 = (long)stride;
  puVar47 = filtered_data + lVar41 + 1;
  puVar48 = data + 1;
  iVar44 = 1;
  lVar50 = 1;
  puVar46 = data;
  local_48 = filtered_data;
  while( true ) {
    puVar48 = puVar48 + lVar41;
    if (height <= iVar44) break;
    local_48[lVar41] = puVar46[lVar41] - (puVar46 + lVar41)[-lVar41];
    local_48 = local_48 + lVar41;
    lVar49 = lVar50;
    for (lVar45 = 0; lVar45 < (int)(length & 0xfffffff8); lVar45 = lVar45 + 8) {
      uVar1 = *(ulong *)(puVar48 + lVar45 + -1);
      uVar2 = *(ulong *)(puVar46 + lVar45 + 1);
      uVar3 = *(ulong *)(puVar46 + lVar45);
      uVar4 = *(undefined8 *)(puVar48 + lVar45);
      auVar5._8_6_ = 0;
      auVar5._0_8_ = uVar1;
      auVar5[0xe] = (char)(uVar1 >> 0x38);
      auVar8._8_4_ = 0;
      auVar8._0_8_ = uVar1;
      auVar8[0xc] = (char)(uVar1 >> 0x30);
      auVar8._13_2_ = auVar5._13_2_;
      auVar11._8_4_ = 0;
      auVar11._0_8_ = uVar1;
      auVar11._12_3_ = auVar8._12_3_;
      auVar14._8_2_ = 0;
      auVar14._0_8_ = uVar1;
      auVar14[10] = (char)(uVar1 >> 0x28);
      auVar14._11_4_ = auVar11._11_4_;
      auVar17._8_2_ = 0;
      auVar17._0_8_ = uVar1;
      auVar17._10_5_ = auVar14._10_5_;
      auVar20[8] = (char)(uVar1 >> 0x20);
      auVar20._0_8_ = uVar1;
      auVar20._9_6_ = auVar17._9_6_;
      auVar26._7_8_ = 0;
      auVar26._0_7_ = auVar20._8_7_;
      Var27 = CONCAT81(SUB158(auVar26 << 0x40,7),(char)(uVar1 >> 0x18));
      auVar35._9_6_ = 0;
      auVar35._0_9_ = Var27;
      auVar28._1_10_ = SUB1510(auVar35 << 0x30,5);
      auVar28[0] = (char)(uVar1 >> 0x10);
      auVar36._11_4_ = 0;
      auVar36._0_11_ = auVar28;
      auVar23[2] = (char)(uVar1 >> 8);
      auVar23._0_2_ = (ushort)uVar1;
      auVar23._3_12_ = SUB1512(auVar36 << 0x20,3);
      auVar6._8_6_ = 0;
      auVar6._0_8_ = uVar2;
      auVar6[0xe] = (char)(uVar2 >> 0x38);
      auVar9._8_4_ = 0;
      auVar9._0_8_ = uVar2;
      auVar9[0xc] = (char)(uVar2 >> 0x30);
      auVar9._13_2_ = auVar6._13_2_;
      auVar12._8_4_ = 0;
      auVar12._0_8_ = uVar2;
      auVar12._12_3_ = auVar9._12_3_;
      auVar15._8_2_ = 0;
      auVar15._0_8_ = uVar2;
      auVar15[10] = (char)(uVar2 >> 0x28);
      auVar15._11_4_ = auVar12._11_4_;
      auVar18._8_2_ = 0;
      auVar18._0_8_ = uVar2;
      auVar18._10_5_ = auVar15._10_5_;
      auVar21[8] = (char)(uVar2 >> 0x20);
      auVar21._0_8_ = uVar2;
      auVar21._9_6_ = auVar18._9_6_;
      auVar29._7_8_ = 0;
      auVar29._0_7_ = auVar21._8_7_;
      Var30 = CONCAT81(SUB158(auVar29 << 0x40,7),(char)(uVar2 >> 0x18));
      auVar37._9_6_ = 0;
      auVar37._0_9_ = Var30;
      auVar31._1_10_ = SUB1510(auVar37 << 0x30,5);
      auVar31[0] = (char)(uVar2 >> 0x10);
      auVar38._11_4_ = 0;
      auVar38._0_11_ = auVar31;
      auVar24[2] = (char)(uVar2 >> 8);
      auVar24._0_2_ = (ushort)uVar2;
      auVar24._3_12_ = SUB1512(auVar38 << 0x20,3);
      auVar7._8_6_ = 0;
      auVar7._0_8_ = uVar3;
      auVar7[0xe] = (char)(uVar3 >> 0x38);
      auVar10._8_4_ = 0;
      auVar10._0_8_ = uVar3;
      auVar10[0xc] = (char)(uVar3 >> 0x30);
      auVar10._13_2_ = auVar7._13_2_;
      auVar13._8_4_ = 0;
      auVar13._0_8_ = uVar3;
      auVar13._12_3_ = auVar10._12_3_;
      auVar16._8_2_ = 0;
      auVar16._0_8_ = uVar3;
      auVar16[10] = (char)(uVar3 >> 0x28);
      auVar16._11_4_ = auVar13._11_4_;
      auVar19._8_2_ = 0;
      auVar19._0_8_ = uVar3;
      auVar19._10_5_ = auVar16._10_5_;
      auVar22[8] = (char)(uVar3 >> 0x20);
      auVar22._0_8_ = uVar3;
      auVar22._9_6_ = auVar19._9_6_;
      auVar32._7_8_ = 0;
      auVar32._0_7_ = auVar22._8_7_;
      Var33 = CONCAT81(SUB158(auVar32 << 0x40,7),(char)(uVar3 >> 0x18));
      auVar39._9_6_ = 0;
      auVar39._0_9_ = Var33;
      auVar34._1_10_ = SUB1510(auVar39 << 0x30,5);
      auVar34[0] = (char)(uVar3 >> 0x10);
      auVar40._11_4_ = 0;
      auVar40._0_11_ = auVar34;
      auVar25[2] = (char)(uVar3 >> 8);
      auVar25._0_2_ = (ushort)uVar3;
      auVar25._3_12_ = SUB1512(auVar40 << 0x20,3);
      sVar51 = (((ushort)uVar2 & 0xff) + ((ushort)uVar1 & 0xff)) - ((ushort)uVar3 & 0xff);
      sVar52 = (auVar24._2_2_ + auVar23._2_2_) - auVar25._2_2_;
      sVar53 = (auVar31._0_2_ + auVar28._0_2_) - auVar34._0_2_;
      sVar54 = ((short)Var30 + (short)Var27) - (short)Var33;
      sVar55 = (auVar21._8_2_ + auVar20._8_2_) - auVar22._8_2_;
      sVar56 = (auVar15._10_2_ + auVar14._10_2_) - auVar16._10_2_;
      sVar57 = (auVar9._12_2_ + auVar8._12_2_) - auVar10._12_2_;
      sVar58 = ((auVar6._13_2_ >> 8) + (auVar5._13_2_ >> 8)) - (auVar7._13_2_ >> 8);
      *(ulong *)(puVar47 + lVar45) =
           CONCAT17((char)((ulong)uVar4 >> 0x38) -
                    ((0 < sVar58) * (sVar58 < 0x100) * (char)sVar58 - (0xff < sVar58)),
                    CONCAT16((char)((ulong)uVar4 >> 0x30) -
                             ((0 < sVar57) * (sVar57 < 0x100) * (char)sVar57 - (0xff < sVar57)),
                             CONCAT15((char)((ulong)uVar4 >> 0x28) -
                                      ((0 < sVar56) * (sVar56 < 0x100) * (char)sVar56 -
                                      (0xff < sVar56)),
                                      CONCAT14((char)((ulong)uVar4 >> 0x20) -
                                               ((0 < sVar55) * (sVar55 < 0x100) * (char)sVar55 -
                                               (0xff < sVar55)),
                                               CONCAT13((char)((ulong)uVar4 >> 0x18) -
                                                        ((0 < sVar54) * (sVar54 < 0x100) *
                                                         (char)sVar54 - (0xff < sVar54)),
                                                        CONCAT12((char)((ulong)uVar4 >> 0x10) -
                                                                 ((0 < sVar53) * (sVar53 < 0x100) *
                                                                  (char)sVar53 - (0xff < sVar53)),
                                                                 CONCAT11((char)((ulong)uVar4 >> 8)
                                                                          - ((0 < sVar52) *
                                                                             (sVar52 < 0x100) *
                                                                             (char)sVar52 -
                                                                            (0xff < sVar52)),
                                                                          (char)uVar4 -
                                                                          ((0 < sVar51) *
                                                                           (sVar51 < 0x100) *
                                                                           (char)sVar51 -
                                                                          (0xff < sVar51)))))))));
      lVar49 = lVar49 + 8;
    }
    for (; lVar45 < (int)length; lVar45 = lVar45 + 1) {
      iVar43 = ((uint)data[lVar49] + (uint)data[lVar49 + lVar41 + -1]) - (uint)data[lVar49 + -1];
      if (iVar43 < 1) {
        iVar43 = 0;
      }
      cVar42 = (char)iVar43;
      if (0xfe < iVar43) {
        cVar42 = -1;
      }
      filtered_data[lVar49 + lVar41] = data[lVar49 + lVar41] - cVar42;
      lVar49 = lVar49 + 1;
    }
    iVar44 = iVar44 + 1;
    puVar47 = puVar47 + lVar41;
    lVar50 = lVar50 + lVar41;
    puVar46 = puVar46 + lVar41;
  }
  return;
}

Assistant:

static void GradientFilter_SSE2(const uint8_t* WEBP_RESTRICT data,
                                int width, int height, int stride,
                                uint8_t* WEBP_RESTRICT filtered_data) {
  DoGradientFilter_SSE2(data, width, height, stride, filtered_data);
}